

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

void do_specialize(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CClass *this;
  ulong uVar3;
  long lVar4;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var5;
  char buf [4608];
  int style;
  int i;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  undefined8 in_stack_ffffffffffffedc0;
  undefined1 deduct;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  CHAR_DATA *ch_00;
  char_data *in_stack_ffffffffffffedd0;
  char local_1218 [4608];
  int local_18;
  int local_14;
  char *local_10;
  long local_8;
  
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = is_npc(in_stack_ffffffffffffedb8);
  if (!bVar1) {
    this = char_data::Class(in_stack_ffffffffffffedd0);
    iVar2 = CClass::GetIndex(this);
    if (iVar2 == 1) {
      bVar1 = str_cmp(local_10,"");
      iVar2 = (int)((ulong)in_stack_ffffffffffffedc0 >> 0x20);
      if (bVar1) {
        if (*(short *)(*(long *)(local_8 + 0xc0) + 0x86) == 0) {
          send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
        }
        else {
          local_18 = style_lookup((char *)in_stack_ffffffffffffedb8);
          if (local_18 == 0) {
            send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
          }
          else {
            _Var5 = std::pow<int,long>(iVar2,(long)in_stack_ffffffffffffedb8);
            uVar3 = (ulong)_Var5;
            ch_00 = *(CHAR_DATA **)(local_8 + 0xc0);
            lVar4 = (long)(int)((long)((ulong)(uint)((int)style_table[local_18].bit >> 0x1f) << 0x20
                                      | style_table[local_18].bit & 0xffffffffU) / 0x20);
            ch_00[3].progtypes[lVar4 + 3] = uVar3 | ch_00[3].progtypes[lVar4 + 3];
            *(short *)(*(long *)(local_8 + 0xc0) + 0x86) =
                 *(short *)(*(long *)(local_8 + 0xc0) + 0x86) + -1;
            sprintf(local_1218,"You are now specialized in the %s fighting style.\n\r",
                    style_table[local_18].name);
            deduct = (undefined1)(uVar3 >> 0x38);
            send_to_char((char *)in_stack_ffffffffffffedd0,ch_00);
            group_add(in_stack_ffffffffffffedd0,(char *)ch_00,(bool)deduct);
            lVar4 = *(long *)(local_8 + 0xc0);
            iVar2 = skill_lookup((char *)ch_00);
            *(undefined2 *)(lVar4 + 1000 + (long)iVar2 * 2) = 2;
            if (*(short *)(*(long *)(local_8 + 0xc0) + 0xcba) == 0) {
              *(short *)(*(long *)(local_8 + 0xc0) + 0xcba) = (short)local_18;
            }
          }
        }
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
        for (local_14 = 1; local_14 < 7; local_14 = local_14 + 1) {
          uVar3 = *(ulong *)(*(long *)(local_8 + 0xc0) + 0xcc0 +
                            (long)(int)(style_table[local_14].bit / 0x20) * 8);
          _Var5 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffedc0 >> 0x20),
                                     (long)in_stack_ffffffffffffedb8);
          if ((uVar3 & (long)_Var5) == 0) {
            send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
            send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
          }
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    }
  }
  return;
}

Assistant:

void do_specialize(CHAR_DATA *ch, char *argument)
{
	int i, style = 0;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (ch->Class()->GetIndex() != CLASS_WARRIOR)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		send_to_char("You can choose from the following specializations:\n\r", ch);

		for (i = 1; i < MAX_STYLE; i++)
		{
			if (!IS_SET(ch->pcdata->styles, style_table[i].bit))
			{
				send_to_char(style_table[i].name, ch);
				send_to_char("\n\r", ch);
			}
		}

		return;
	}

	if (!ch->pcdata->special)
	{
		send_to_char("You have no available specializations.\n\r", ch);
		return;
	}

	style = style_lookup(argument);

	if (!style)
	{
		send_to_char("That's not a valid style to specialize in.\n\r", ch);
		return;
	}

	SET_BIT(ch->pcdata->styles, style_table[style].bit);
	ch->pcdata->special--;

	sprintf(buf, "You are now specialized in the %s fighting style.\n\r", style_table[style].name);
	send_to_char(buf, ch);

	group_add(ch, style_table[style].name, false);

	ch->pcdata->learned[skill_lookup(style_table[style].name)] = 2;

	if (ch->pcdata->style == 0)
		ch->pcdata->style = style;
}